

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

bool __thiscall
RealTrafficConnection::ProcessRecvedTrafficData(RealTrafficConnection *this,char *traffic)

{
  bool bVar1;
  logLevelTy lVar2;
  uint uVar3;
  size_type sVar4;
  unsigned_long uVar5;
  iterator iVar6;
  iterator iVar7;
  FDKeyTy *in_RSI;
  long in_RDI;
  double dVar8;
  bool in_stack_0000006f;
  long in_stack_00000070;
  char *in_stack_00000078;
  LTOnlineChannel *in_stack_00000080;
  string acFilter;
  FDKeyTy fdKey;
  unsigned_long numId;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tfc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000258;
  FDKeyTy *in_stack_00000260;
  RealTrafficConnection *in_stack_00000268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000278;
  FDKeyTy *in_stack_00000280;
  RealTrafficConnection *in_stack_00000288;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined2 in_stack_fffffffffffffe84;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  logLevelTy in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  bool local_15a;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  char *in_stack_fffffffffffffeb8;
  DataRefs *this_00;
  FDKeyTy *this_01;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 bSkipEmpty;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  byte bVar9;
  string *in_stack_fffffffffffffef8;
  string local_e8 [16];
  char *in_stack_ffffffffffffff28;
  unsigned_long in_stack_ffffffffffffff30;
  RealTrafficConnection *in_stack_ffffffffffffff38;
  allocator<char> local_51;
  string local_50 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  FDKeyTy *local_18;
  bool local_1;
  
  bSkipEmpty = (undefined1)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  if ((in_RSI == (FDKeyTy *)0x0) || (*(_Alloc_hider *)&in_RSI->eKeyType == (_Alloc_hider)0x0)) {
    local_1 = false;
  }
  else {
    local_18 = in_RSI;
    LTOnlineChannel::DebugLogRaw
              (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_0000006f);
    dVar8 = DataRefs::GetSimTime(&dataRefs);
    *(double *)(in_RDI + 0x828) = dVar8;
    this_01 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               in_stack_fffffffffffffeb8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    this_00 = (DataRefs *)&stack0xffffffffffffff77;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               (char *)this_00,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    str_tokenize(in_stack_fffffffffffffef8,
                 (string *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (bool)bSkipEmpty);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_30);
    if (sVar4 < 0xb) {
      lVar2 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar2 < 3) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
               ,0x6de,"ProcessRecvedTrafficData",logWARN,
               "RealTraffic: Discarded invalid message: %s",local_18);
      }
      local_1 = false;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_30,1);
      uVar5 = std::__cxx11::stoul((string *)
                                  CONCAT17(in_stack_fffffffffffffe87,
                                           CONCAT16(in_stack_fffffffffffffe86,
                                                    CONCAT24(in_stack_fffffffffffffe84,
                                                             in_stack_fffffffffffffe80))),
                                  (size_t *)
                                  CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),0);
      if (uVar5 == 0) {
        local_1 = true;
      }
      else {
        bVar1 = IsDatagramDuplicate(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                                    in_stack_ffffffffffffff28);
        if (bVar1) {
          local_1 = true;
        }
        else {
          LTFlightData::FDKeyTy::FDKeyTy
                    (this_01,(FDKeyType)((ulong)this_00 >> 0x20),
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          DataRefs::GetDebugAcFilter_abi_cxx11_(this_00);
          uVar3 = std::__cxx11::string::empty();
          bVar9 = 0;
          local_15a = false;
          if ((uVar3 & 1) == 0) {
            std::__cxx11::string::string((string *)&stack0xfffffffffffffef8,local_e8);
            bVar9 = 1;
            local_15a = LTFlightData::FDKeyTy::operator!=
                                  ((FDKeyTy *)
                                   CONCAT17(in_stack_fffffffffffffe87,
                                            CONCAT16(in_stack_fffffffffffffe86,
                                                     CONCAT24(in_stack_fffffffffffffe84,
                                                              in_stack_fffffffffffffe80))),
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          }
          if ((bVar9 & 1) != 0) {
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
          }
          if (local_15a == false) {
            iVar6 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
            iVar7 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
            std::
            for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,RealTrafficConnection::ProcessRecvedTrafficData(char_const*)::__0>
                      (iVar6._M_current,iVar7._M_current);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_30,0);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffe87,
                                                CONCAT16(in_stack_fffffffffffffe86,
                                                         CONCAT24(in_stack_fffffffffffffe84,
                                                                  in_stack_fffffffffffffe80))),
                                    (char *)CONCAT44(in_stack_fffffffffffffe7c,
                                                     in_stack_fffffffffffffe78));
            in_stack_fffffffffffffe94 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe94);
            if (bVar1) {
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(&local_30);
              if (sVar4 < 0x2a) {
                in_stack_fffffffffffffe90 = DataRefs::GetLogLevel(&dataRefs);
                if ((int)in_stack_fffffffffffffe90 < 3) {
                  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                         ,0x702,"ProcessRecvedTrafficData",logWARN,
                         "RealTraffic: Discarded invalid message: %s",local_18);
                }
                local_1 = false;
              }
              else {
                local_1 = ProcessRTTFC(in_stack_00000288,in_stack_00000280,in_stack_00000278);
              }
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_30,0);
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffe87,
                                                  CONCAT16(in_stack_fffffffffffffe86,
                                                           CONCAT24(in_stack_fffffffffffffe84,
                                                                    in_stack_fffffffffffffe80))),
                                      (char *)CONCAT44(in_stack_fffffffffffffe7c,
                                                       in_stack_fffffffffffffe78));
              if (bVar1) {
                sVar4 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&local_30);
                if (sVar4 < 0xf) {
                  lVar2 = DataRefs::GetLogLevel(&dataRefs);
                  if ((int)lVar2 < 3) {
                    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                           ,0x708,"ProcessRecvedTrafficData",logWARN,
                           "RealTraffic: Discarded invalid message: %s",local_18);
                  }
                  local_1 = false;
                }
                else {
                  local_1 = ProcessAITFC(in_stack_00000268,in_stack_00000260,in_stack_00000258);
                }
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_30,0);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffe87,
                                                    CONCAT16(in_stack_fffffffffffffe86,
                                                             CONCAT24(in_stack_fffffffffffffe84,
                                                                      in_stack_fffffffffffffe80))),
                                        (char *)CONCAT44(in_stack_fffffffffffffe7c,
                                                         in_stack_fffffffffffffe78));
                if (bVar1) {
                  sVar4 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size(&local_30);
                  if (sVar4 < 0xb) {
                    lVar2 = DataRefs::GetLogLevel(&dataRefs);
                    if ((int)lVar2 < 3) {
                      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                             ,0x70e,"ProcessRecvedTrafficData",logWARN,
                             "RealTraffic: Discarded invalid message: %s",local_18);
                    }
                    local_1 = false;
                  }
                  else {
                    local_1 = ProcessAITFC(in_stack_00000268,in_stack_00000260,in_stack_00000258);
                  }
                }
                else {
                  lVar2 = DataRefs::GetLogLevel(&dataRefs);
                  if ((int)lVar2 < 3) {
                    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                           ,0x714,"ProcessRecvedTrafficData",logWARN,
                           "RealTraffic: Discarded invalid message: %s",local_18);
                  }
                  local_1 = false;
                }
              }
            }
          }
          else {
            local_1 = true;
          }
          std::__cxx11::string::~string(local_e8);
          LTFlightData::FDKeyTy::~FDKeyTy((FDKeyTy *)0x224c46);
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool RealTrafficConnection::ProcessRecvedTrafficData (const char* traffic)
{
    // sanity check: not empty
    if (!traffic || !traffic[0])
        return false;
    
    // Raw data logging
    DebugLogRaw(traffic, HTTP_FLAG_UDP);
    lastReceivedTime = dataRefs.GetSimTime();
    
    // split the datagram up into its parts, keeping empty positions empty
    std::vector<std::string> tfc = str_tokenize(traffic, ",()", false);
    
    // not enough fields found for any message?
    if (tfc.size() < RT_MIN_TFC_FIELDS)
    { LOG_MSG(logWARN, ERR_RT_DISCARDED_MSG, traffic); return false; }
    
    // *** Duplicaton Check ***
    
    // comes in all 3 formats at position 1 and in decimal form
    const unsigned long numId = std::stoul(tfc[RT_AITFC_HEXID]);
    
    // ignore aircraft, which don't want to be tracked
    if (numId == 0)
        return true;            // ignore silently
    
    // RealTraffic sends bursts of data often, but that doesn't necessarily
    // mean that anything really moved. Data could be stale.
    // So here we just completely ignore data which looks exactly like the previous datagram
    if (IsDatagramDuplicate(numId, traffic))
        return true;            // ignore silently

    // key is most likely an Icao transponder code, but could also be a Realtraffic internal id
    LTFlightData::FDKeyTy fdKey (numId <= MAX_TRANSP_ICAO ? LTFlightData::KEY_ICAO : LTFlightData::KEY_RT,
                                 numId);
    
    // not matching a/c filter? -> skip it
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );
    if ((!acFilter.empty() && (fdKey != acFilter)))
        return true;            // silently

    // *** Replace 'null' ***
    std::for_each(tfc.begin(), tfc.end(),
                  [](std::string& s){ if (s == "null") s.clear(); });
    
    // *** Process different formats ****
    
    // There are 3 formats we are _really_ interested in: RTTFC, AITFC, and XTRAFFICPSX
    // Check for them and their correct number of fields
    if (tfc[RT_RTTFC_REC_TYPE] == RT_TRAFFIC_RTTFC) {
        if (tfc.size() < RT_RTTFC_MIN_TFC_FIELDS)
        { LOG_MSG(logWARN, ERR_RT_DISCARDED_MSG, traffic); return false; }

        return ProcessRTTFC(fdKey, tfc);
    }
    else if (tfc[RT_AITFC_REC_TYPE] == RT_TRAFFIC_AITFC) {
        if (tfc.size() < RT_AITFC_NUM_FIELDS_MIN)
        { LOG_MSG(logWARN, ERR_RT_DISCARDED_MSG, traffic); return false; }

        return ProcessAITFC(fdKey, tfc);
    }
    else if (tfc[RT_AITFC_REC_TYPE] == RT_TRAFFIC_XTRAFFICPSX) {
        if (tfc.size() < RT_XTRAFFICPSX_NUM_FIELDS)
        { LOG_MSG(logWARN, ERR_RT_DISCARDED_MSG, traffic); return false; }

        return ProcessAITFC(fdKey, tfc);
    }
    else {
        // other format than AITFC or XTRAFFICPSX
        LOG_MSG(logWARN, ERR_RT_DISCARDED_MSG, traffic);
        return false;
    }
}